

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::CheckNinjaFeatures(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *fv;
  size_type pos;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  cmGlobalNinjaGenerator *local_10;
  cmGlobalNinjaGenerator *this_local;
  
  local_10 = this;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  RequiredNinjaVersionForConsolePool_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,pcVar3,pcVar4);
  this->NinjaSupportsConsolePool = (bool)(~bVar1 & 1);
  std::__cxx11::string::~string(local_30);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  RequiredNinjaVersionForImplicitOuts_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,pcVar3,pcVar4);
  this->NinjaSupportsImplicitOuts = (bool)(~bVar1 & 1);
  std::__cxx11::string::~string(local_60);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  RequiredNinjaVersionForManifestRestat_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,pcVar3,pcVar4);
  this->NinjaSupportsManifestRestat = (bool)(~bVar1 & 1);
  std::__cxx11::string::~string(local_80);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  RequiredNinjaVersionForMultilineDepfile_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,pcVar3,pcVar4);
  this->NinjaSupportsMultilineDepfile = (bool)((bVar1 ^ 0xffU) & 1);
  std::__cxx11::string::~string(local_a0);
  if (CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,".dyndep-",
                 (allocator<char> *)((long)&pos + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
      __cxa_atexit(std::__cxx11::string::~string,&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
    }
  }
  lVar5 = std::__cxx11::string::find((string *)&this->NinjaVersion,0x9c25f0);
  if (lVar5 != -1) {
    lVar6 = std::__cxx11::string::c_str();
    lVar7 = std::__cxx11::string::size();
    cmSystemTools::StringToULong((char *)(lVar6 + lVar5 + lVar7),&this->NinjaSupportsDyndeps);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CheckNinjaFeatures()
{
  this->NinjaSupportsConsolePool = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    RequiredNinjaVersionForConsolePool().c_str());
  this->NinjaSupportsImplicitOuts = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    cmGlobalNinjaGenerator::RequiredNinjaVersionForImplicitOuts().c_str());
  this->NinjaSupportsManifestRestat = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    RequiredNinjaVersionForManifestRestat().c_str());
  this->NinjaSupportsMultilineDepfile = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    RequiredNinjaVersionForMultilineDepfile().c_str());
  {
    // Our ninja branch adds ".dyndep-#" to its version number,
    // where '#' is a feature-specific version number.  Extract it.
    static std::string const k_DYNDEP_ = ".dyndep-";
    std::string::size_type pos = this->NinjaVersion.find(k_DYNDEP_);
    if (pos != std::string::npos) {
      const char* fv = this->NinjaVersion.c_str() + pos + k_DYNDEP_.size();
      cmSystemTools::StringToULong(fv, &this->NinjaSupportsDyndeps);
    }
  }
}